

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int uv_pipe_getsockname(uv_pipe_t *handle,char *buffer,size_t *size)

{
  int iVar1;
  size_t *size_local;
  char *buffer_local;
  uv_pipe_t *handle_local;
  
  iVar1 = uv__pipe_getsockpeername(handle,getsockname,buffer,size);
  return iVar1;
}

Assistant:

int uv_pipe_getsockname(const uv_pipe_t* handle, char* buffer, size_t* size) {
  return uv__pipe_getsockpeername(handle, getsockname, buffer, size);
}